

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<bool>::InternalDeallocate<false>(RepeatedField<bool> *this)

{
  RepeatedField<bool> local_10;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    InternalDeallocate<false>(this);
    return;
  }
  InternalDeallocate<false>(&local_10);
}

Assistant:

void InternalDeallocate() {
    ABSL_DCHECK(!is_soo());
    const size_t bytes = Capacity(false) * sizeof(Element) + kHeapRepHeaderSize;
    if (heap_rep()->arena == nullptr) {
      internal::SizedDelete(heap_rep(), bytes);
    } else if (!in_destructor) {
      // If we are in the destructor, we might be being destroyed as part of
      // the arena teardown. We can't try and return blocks to the arena then.
      heap_rep()->arena->ReturnArrayMemory(heap_rep(), bytes);
    }
  }